

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp_number.hpp
# Opt level: O3

self_ * __thiscall
standards::exp_number<double>::operator+=(exp_number<double> *this,exp_number<double> *rhs)

{
  double dVar1;
  double dVar2;
  double local_10;
  
  if (this->sign_ == -1) {
    if (rhs->sign_ != -1) {
      if (rhs->sign_ != 1) {
        return this;
      }
      local_10 = this->log_;
      dVar1 = rhs->log_;
      if (local_10 <= dVar1) {
        if (local_10 < dVar1) {
          dVar2 = exp(local_10 - dVar1);
          dVar2 = ::log(1.0 - dVar2);
          this->log_ = dVar2 + dVar1;
          this->sign_ = 1;
          return this;
        }
        goto LAB_0010d355;
      }
      goto LAB_0010d2dd;
    }
  }
  else {
    if (this->sign_ != 1) {
      this->log_ = rhs->log_;
      this->sign_ = rhs->sign_;
      return this;
    }
    if (rhs->sign_ == -1) {
      local_10 = this->log_;
      dVar1 = rhs->log_;
      if (local_10 <= dVar1) {
        if (local_10 < dVar1) {
          dVar2 = exp(local_10 - dVar1);
          dVar2 = ::log(1.0 - dVar2);
          this->log_ = dVar2 + dVar1;
          this->sign_ = -1;
          return this;
        }
LAB_0010d355:
        this->sign_ = 0;
        return this;
      }
LAB_0010d2dd:
      dVar1 = exp(dVar1 - local_10);
      dVar1 = 1.0 - dVar1;
      goto LAB_0010d300;
    }
    if (rhs->sign_ != 1) {
      return this;
    }
  }
  dVar1 = this->log_;
  dVar2 = rhs->log_;
  local_10 = dVar2;
  if (dVar2 <= dVar1) {
    local_10 = dVar1;
  }
  dVar1 = exp((double)((ulong)(dVar1 - dVar2) | (ulong)DAT_0010e0c0));
  dVar1 = dVar1 + 1.0;
LAB_0010d300:
  dVar1 = ::log(dVar1);
  this->log_ = dVar1 + local_10;
  return this;
}

Assistant:

self_& operator+=(exp_number<U> const& rhs) {
    if (sign_ == is_positive) {
      if (rhs.sign_ == is_positive) {
        // pos + pos
        log_ = std::max(log_, rhs.log_) + std::log(1 + std::exp(-std::abs(log_ - rhs.log_)));
      } else if (rhs.sign_ == is_negative) {
        if (log_ > rhs.log_) {
          // pos + neg = pos
          log_ = log_ + std::log(1 - std::exp(rhs.log_ - log_));
        } else if (log_ < rhs.log_) {
          // pos + neg = neg
          log_ = rhs.log_ + std::log(1 - std::exp(log_ - rhs.log_));
          sign_ = is_negative;
        } else {
          // pos + neg = zero
          sign_ = is_zero;
        }
      }
    } else if (sign_ == is_negative) {
      if (rhs.sign_ == is_positive) {
        if (log_ > rhs.log_) {
          // neg + pos = neg
          log_ = log_ + std::log(1 - std::exp(rhs.log_ - log_));
        } else if (log_ < rhs.log_) {
          // neg + pos = pos
          log_ = rhs.log_ + std::log(1 - std::exp(log_ - rhs.log_));
          sign_ = is_positive;
        } else {
          // neg + pos = zero
          sign_ = is_zero;
        }
      } else if (rhs.sign_ == is_negative)
        // neg + neg
        log_ = std::max(log_, rhs.log_) + std::log(1 + std::exp(-std::abs(log_ - rhs.log_)));
    } else {
      log_ = rhs.log_;
      sign_ = rhs.sign_;
    }
    return *this;
  }